

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_hilbert.cpp
# Opt level: O3

Read<long> __thiscall Omega_h::hilbert::dists_from_coords_dim<2>(hilbert *this,Reals *coords)

{
  int *piVar1;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  int size_in;
  size_t sVar2;
  Alloc *pAVar3;
  void *pvVar4;
  double dVar5;
  undefined1 auVar6 [16];
  Read<long> RVar7;
  Write<long> out;
  Write<long> local_f8;
  Write<long> local_e8;
  Reals local_d8;
  type_conflict local_c8;
  double local_78;
  double dStack_70;
  undefined1 local_68 [16];
  Alloc *local_58;
  void *pvStack_50;
  BBox<2> local_48;
  
  local_d8.write_.shared_alloc_.alloc = (coords->write_).shared_alloc_.alloc;
  if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d8.write_.shared_alloc_.alloc =
           (Alloc *)((local_d8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_d8.write_.shared_alloc_.alloc)->use_count =
           (local_d8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_d8.write_.shared_alloc_.direct_ptr = (coords->write_).shared_alloc_.direct_ptr;
  find_bounding_box<2>(&local_48,&local_d8);
  pAVar3 = local_d8.write_.shared_alloc_.alloc;
  if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_d8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_d8.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_c8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
       local_48.max.super_Few<double,_2>.array_[1] - local_48.min.super_Few<double,_2>.array_[1];
  if (local_48.max.super_Few<double,_2>.array_[1] - local_48.min.super_Few<double,_2>.array_[1] <=
      local_48.max.super_Few<double,_2>.array_[0] - local_48.min.super_Few<double,_2>.array_[0]) {
    local_c8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1]
         = local_48.max.super_Few<double,_2>.array_[0] - local_48.min.super_Few<double,_2>.array_[0]
    ;
  }
  local_c8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
       local_c8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_
       [1] + local_48.min.super_Few<double,_2>.array_[0];
  local_c8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
       local_c8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_
       [1] + local_48.min.super_Few<double,_2>.array_[1];
  local_c8.coords.write_.shared_alloc_.alloc = (Alloc *)local_48.min.super_Few<double,_2>.array_[0];
  local_c8.coords.write_.shared_alloc_.direct_ptr =
       (void *)local_48.min.super_Few<double,_2>.array_[1];
  pAVar3 = (coords->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    sVar2 = pAVar3->size;
  }
  else {
    sVar2 = (ulong)pAVar3 >> 3;
  }
  local_48.max.super_Few<double,_2>.array_[0] =
       local_c8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_
       [0];
  local_48.max.super_Few<double,_2>.array_[1] =
       local_c8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_
       [1];
  if (((uint)sVar2 >> 3 & 1) == 0) {
    local_58 = (Alloc *)local_48.min.super_Few<double,_2>.array_[0];
    pvStack_50 = (void *)local_48.min.super_Few<double,_2>.array_[1];
    local_68._8_8_ =
         local_c8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.
         array_[0];
    local_68._0_8_ = local_48.min.super_Few<double,_2>.array_[1];
    local_c8.coords.write_.shared_alloc_.alloc = (Alloc *)&local_c8.unit_affine;
    local_78 = local_c8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].
               super_Few<double,_2>.array_[0];
    dStack_70 = local_c8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].
                super_Few<double,_2>.array_[1];
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
    size_in = (int)(sVar2 >> 3);
    Write<long>::Write(&local_f8,size_in,(string *)&local_c8);
    auVar6._0_8_ = local_78 - (double)local_58;
    auVar6._8_8_ = dStack_70 - (double)pvStack_50;
    auVar6 = divpd(_DAT_00449120,auVar6);
    local_c8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1]
         = auVar6._8_8_;
    pAVar3 = (Alloc *)((double)local_68._0_8_ * 0.0 + (double)local_58 * auVar6._0_8_);
    pvVar4 = (void *)(local_c8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[1].
                      super_Few<double,_2>.array_[1] * (double)local_68._0_8_ +
                     (double)local_58 * 0.0);
    dVar5 = auVar6._0_8_;
    if (local_c8.coords.write_.shared_alloc_.alloc != (Alloc *)&local_c8.unit_affine) {
      local_78 = local_c8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[1].
                 super_Few<double,_2>.array_[1];
      dStack_70 = local_c8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[1].
                  super_Few<double,_2>.array_[1];
      local_68 = auVar6;
      local_58 = pAVar3;
      pvStack_50 = pvVar4;
      operator_delete(local_c8.coords.write_.shared_alloc_.alloc,
                      (long)local_c8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].
                            super_Few<double,_2>.array_[0] + 1);
      pAVar3 = local_58;
      pvVar4 = pvStack_50;
      local_c8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_
      [1] = local_78;
      dVar5 = (double)local_68._0_8_;
    }
    local_c8.unit_affine.t.super_Few<double,_2>.array_[0] = -(double)pAVar3;
    local_c8.unit_affine.t.super_Few<double,_2>.array_[1] = -(double)pvVar4;
    local_c8.coords.write_.shared_alloc_.alloc = (coords->write_).shared_alloc_.alloc;
    if (((ulong)local_c8.coords.write_.shared_alloc_.alloc & 7) == 0 &&
        local_c8.coords.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_c8.coords.write_.shared_alloc_.alloc =
             (Alloc *)((local_c8.coords.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_c8.coords.write_.shared_alloc_.alloc)->use_count =
             (local_c8.coords.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_c8.coords.write_.shared_alloc_.direct_ptr = (coords->write_).shared_alloc_.direct_ptr;
    local_c8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1]
         = 0.0;
    local_c8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0]
         = 0.0;
    local_c8.out.shared_alloc_.alloc = local_f8.shared_alloc_.alloc;
    if (((ulong)local_f8.shared_alloc_.alloc & 7) == 0 &&
        local_f8.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_c8.out.shared_alloc_.alloc = (Alloc *)((local_f8.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_f8.shared_alloc_.alloc)->use_count = (local_f8.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_c8.out.shared_alloc_.direct_ptr = local_f8.shared_alloc_.direct_ptr;
    local_c8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0]
         = dVar5;
    parallel_for<Omega_h::hilbert::dists_from_coords_dim<2>(Omega_h::Read<double>)::_lambda(int)_1_>
              (size_in >> 1,&local_c8,"hilbert::dists_from_coords");
    local_e8.shared_alloc_.alloc = local_f8.shared_alloc_.alloc;
    local_e8.shared_alloc_.direct_ptr = local_f8.shared_alloc_.direct_ptr;
    if ((((ulong)local_f8.shared_alloc_.alloc & 7) == 0 &&
         local_f8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_f8.shared_alloc_.alloc)->use_count = (local_f8.shared_alloc_.alloc)->use_count + -1;
      local_e8.shared_alloc_.alloc = (Alloc *)((local_f8.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_f8.shared_alloc_.alloc = (Alloc *)0x0;
    local_f8.shared_alloc_.direct_ptr = (void *)0x0;
    Read<long>::Read((Read<signed_char> *)this,&local_e8);
    pAVar3 = local_e8.shared_alloc_.alloc;
    pvVar4 = extraout_RDX;
    if (((ulong)local_e8.shared_alloc_.alloc & 7) == 0 &&
        local_e8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_e8.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_e8.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
        pvVar4 = extraout_RDX_00;
      }
    }
    pAVar3 = local_c8.out.shared_alloc_.alloc;
    if (((ulong)local_c8.out.shared_alloc_.alloc & 7) == 0 &&
        local_c8.out.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_c8.out.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_c8.out.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
        pvVar4 = extraout_RDX_01;
      }
    }
    pAVar3 = local_c8.coords.write_.shared_alloc_.alloc;
    if (((ulong)local_c8.coords.write_.shared_alloc_.alloc & 7) == 0 &&
        local_c8.coords.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_c8.coords.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_c8.coords.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
        pvVar4 = extraout_RDX_02;
      }
    }
    pAVar3 = local_f8.shared_alloc_.alloc;
    if (((ulong)local_f8.shared_alloc_.alloc & 7) == 0 &&
        local_f8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_f8.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_f8.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
        pvVar4 = extraout_RDX_03;
      }
    }
    RVar7.write_.shared_alloc_.direct_ptr = pvVar4;
    RVar7.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<long>)RVar7.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a % b == 0",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_scalar.hpp"
       ,0x11a);
}

Assistant:

Read<I64> dists_from_coords_dim(Reals coords) {
  auto bbox = find_bounding_box<dim>(coords);
  bbox = make_equilateral(bbox);
  auto unit_affine = get_affine_from_bbox_into_unit(bbox);
  auto npts = divide_no_remainder(coords.size(), dim);
  Write<I64> out(npts * dim);
  auto f = OMEGA_H_LAMBDA(LO i) {
    constexpr Int nbits = MANTISSA_BITS;
    auto spatial_coord = get_vector<dim>(coords, i);
    auto hilbert_coord =
        hilbert::from_spatial(unit_affine, nbits, spatial_coord);
    for (Int j = 0; j < dim; ++j) {
      auto sv = static_cast<I64>(hilbert_coord[j]);
      OMEGA_H_CHECK(sv >= 0);
      out[i * dim + j] = sv;
    }
  };
  parallel_for(npts, f, "hilbert::dists_from_coords");
  return out;
}